

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

void __thiscall
Chainstate::Chainstate
          (Chainstate *this,CTxMemPool *mempool,BlockManager *blockman,ChainstateManager *chainman,
          optional<uint256> from_snapshot_blockhash)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_chainstate_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_chainstate_mutex).super_mutex.super___mutex_base._M_mutex + 0x10)
       = 0;
  (this->m_chainstate_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_chainstate_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_chainstate_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0
  ;
  this->m_mempool = mempool;
  this->m_cached_snapshot_base = (CBlockIndex *)0x0;
  (this->m_coins_views)._M_t.super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>.
  _M_t.super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
  super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl = (CoinsViews *)0x0;
  this->m_disabled = false;
  this->m_blockman = blockman;
  this->m_chainman = chainman;
  (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   &(this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_payload =
       from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
       super__Optional_payload_base<uint256>._M_payload._0_4_;
  *(undefined4 *)
   ((long)&(this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload + 4) =
       from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
       super__Optional_payload_base<uint256>._M_payload._4_4_;
  *(undefined4 *)
   ((long)&(this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload + 8) =
       from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
       super__Optional_payload_base<uint256>._M_payload._8_4_;
  *(undefined4 *)
   ((long)&(this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload + 0xc) =
       from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
       super__Optional_payload_base<uint256>._M_payload._12_4_;
  *(undefined4 *)
   ((long)&(this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload + 0x10) =
       from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
       super__Optional_payload_base<uint256>._M_payload._16_4_;
  *(undefined4 *)
   ((long)&(this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload + 0x14) =
       from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
       super__Optional_payload_base<uint256>._M_payload._20_4_;
  *(undefined4 *)
   ((long)&(this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload + 0x18) =
       from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
       super__Optional_payload_base<uint256>._M_payload._24_4_;
  *(undefined4 *)
   ((long)&(this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload + 0x1c) =
       from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
       super__Optional_payload_base<uint256>._M_payload._28_4_;
  (this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
  super__Optional_payload_base<uint256>._M_engaged =
       from_snapshot_blockhash.super__Optional_base<uint256,_true,_true>._M_payload.
       super__Optional_payload_base<uint256>._M_engaged;
  p_Var1 = &(this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header;
  (this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    this->m_coinstip_cache_size_bytes = 0;
    (this->m_last_write).__d.__r = 0;
    (this->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this->m_coinsdb_cache_size_bytes = 0;
    (this->m_last_flush).__d.__r = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

Chainstate::Chainstate(
    CTxMemPool* mempool,
    BlockManager& blockman,
    ChainstateManager& chainman,
    std::optional<uint256> from_snapshot_blockhash)
    : m_mempool(mempool),
      m_blockman(blockman),
      m_chainman(chainman),
      m_from_snapshot_blockhash(from_snapshot_blockhash) {}